

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernels.hpp
# Opt level: O2

double duckdb::DistanceSquaredOp::Operation<double>(double *lhs_data,double *rhs_data,idx_t count)

{
  idx_t i;
  idx_t iVar1;
  double *r_ptr;
  double *l_ptr;
  double distance;
  
  distance = 0.0;
  for (iVar1 = 0; count != iVar1; iVar1 = iVar1 + 1) {
    distance = distance + (lhs_data[iVar1] - rhs_data[iVar1]) * (lhs_data[iVar1] - rhs_data[iVar1]);
  }
  return distance;
}

Assistant:

static TYPE Operation(const TYPE *lhs_data, const TYPE *rhs_data, const idx_t count) {

		TYPE distance = 0;

		auto l_ptr = lhs_data;
		auto r_ptr = rhs_data;

		for (idx_t i = 0; i < count; i++) {
			const auto x = *l_ptr++;
			const auto y = *r_ptr++;
			const auto diff = x - y;
			distance += diff * diff;
		}

		return distance;
	}